

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t pack_mode7_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint32_t a,uint8_t *pSelectors,
                   uint32_t num_pixels,color_quad_u8 *pPixels)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint in_ECX;
  uint in_EDX;
  uint64_t *in_RSI;
  uint in_R8D;
  uint in_R9D;
  uint32_t i_2;
  uint64_t total_err;
  uint in_stack_00000010;
  uint32_t high;
  uint32_t low;
  uint32_t i_1;
  color_quad_u8 p;
  uint32_t i;
  endpoint_err *pEa;
  endpoint_err *pEb;
  endpoint_err *pEg;
  endpoint_err *pEr;
  uint32_t best_lo_p;
  uint32_t best_hi_p;
  uint32_t err;
  uint32_t lo_p;
  uint32_t hi_p;
  uint32_t p_1;
  uint32_t best_p;
  uint32_t best_err;
  undefined4 in_stack_ffffffffffffff78;
  uint64_t uVar4;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint uVar5;
  undefined1 local_68 [4];
  uint local_64;
  endpoint_err *local_60;
  endpoint_err *local_58;
  endpoint_err *local_50;
  endpoint_err *local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint64_t *local_10;
  
  local_24 = 0xffffffff;
  local_28 = 0;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    local_30 = local_2c >> 1;
    local_34 = local_2c & 1;
    local_38 = (uint)g_bc7_mode_7_optimal_endpoints[in_EDX][local_30][local_34].m_error +
               (uint)g_bc7_mode_7_optimal_endpoints[in_ECX][local_30][local_34].m_error +
               (uint)g_bc7_mode_7_optimal_endpoints[in_R8D][local_30][local_34].m_error +
               (uint)g_bc7_mode_7_optimal_endpoints[in_R9D][local_30][local_34].m_error;
    if ((local_38 < local_24) && (local_28 = local_2c, local_24 = local_38, local_38 == 0)) break;
  }
  local_3c = local_28 >> 1;
  local_40 = local_28 & 1;
  local_48 = g_bc7_mode_7_optimal_endpoints[in_EDX][local_3c] + local_40;
  local_50 = g_bc7_mode_7_optimal_endpoints[in_ECX][local_3c] + local_40;
  local_58 = g_bc7_mode_7_optimal_endpoints[in_R8D][local_3c] + local_40;
  local_60 = g_bc7_mode_7_optimal_endpoints[in_R9D][local_3c] + local_40;
  local_10 = in_RSI;
  color_quad_u8_set((color_quad_u8 *)(in_RSI + 1),(uint)local_48->m_lo,(uint)local_50->m_lo,
                    (uint)local_58->m_lo,(uint)local_60->m_lo);
  color_quad_u8_set((color_quad_u8 *)((long)local_10 + 0xc),(uint)local_48->m_hi,
                    (uint)local_50->m_hi,(uint)local_58->m_hi,(uint)local_60->m_hi);
  *(uint *)(local_10 + 2) = local_40;
  *(uint *)((long)local_10 + 0x14) = local_3c;
  for (local_64 = 0; local_64 < in_stack_00000010; local_64 = local_64 + 1) {
    *(undefined1 *)(total_err + local_64) = 1;
  }
  for (uVar5 = 0; uVar5 < 4; uVar5 = uVar5 + 1) {
    uVar1 = (uint)*(byte *)((long)local_10 + (ulong)uVar5 + 8) << 1 | (uint)local_10[2];
    uVar2 = (uint)*(byte *)((long)local_10 + (ulong)uVar5 + 0xc) << 1 |
            *(uint *)((long)local_10 + 0x14);
    in_stack_ffffffffffffff90 = uVar1 << 2 | uVar1 >> 6;
    in_stack_ffffffffffffff8c = uVar2 << 2 | uVar2 >> 6;
    local_68[uVar5] =
         (char)(in_stack_ffffffffffffff90 * 0x2b + in_stack_ffffffffffffff8c * 0x15 + 0x20 >> 6);
  }
  uVar4 = 0;
  for (uVar1 = 0; uVar1 < in_stack_00000010; uVar1 = uVar1 + 1) {
    uVar3 = compute_color_distance_rgba
                      ((color_quad_u8 *)CONCAT44(uVar5,in_stack_ffffffffffffff90),
                       (color_quad_u8 *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (bc7enc_bool)(uVar4 >> 0x38),
                       (uint32_t *)CONCAT44(uVar1,in_stack_ffffffffffffff78));
    uVar4 = uVar3 + uVar4;
  }
  *local_10 = uVar4;
  return uVar4;
}

Assistant:

static uint64_t pack_mode7_to_one_color(const color_cell_compressor_params* pParams, color_cell_compressor_results* pResults, uint32_t r, uint32_t g, uint32_t b, uint32_t a,
	uint8_t* pSelectors, uint32_t num_pixels, const color_quad_u8* pPixels)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 4; p++)
	{
		uint32_t hi_p = p >> 1;
		uint32_t lo_p = p & 1;
		uint32_t err = g_bc7_mode_7_optimal_endpoints[r][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[g][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[b][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[a][hi_p][lo_p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	uint32_t best_hi_p = best_p >> 1;
	uint32_t best_lo_p = best_p & 1;

	const endpoint_err* pEr = &g_bc7_mode_7_optimal_endpoints[r][best_hi_p][best_lo_p];
	const endpoint_err* pEg = &g_bc7_mode_7_optimal_endpoints[g][best_hi_p][best_lo_p];
	const endpoint_err* pEb = &g_bc7_mode_7_optimal_endpoints[b][best_hi_p][best_lo_p];
	const endpoint_err* pEa = &g_bc7_mode_7_optimal_endpoints[a][best_hi_p][best_lo_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, pEa->m_lo);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, pEa->m_hi);
	pResults->m_pbits[0] = best_lo_p;
	pResults->m_pbits[1] = best_hi_p;

	for (uint32_t i = 0; i < num_pixels; i++)
		pSelectors[i] = BC7E_MODE_7_OPTIMAL_INDEX;

	color_quad_u8 p;

	for (uint32_t i = 0; i < 4; i++)
	{
		uint32_t low = (pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0];
		uint32_t high = (pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[1];

		low = (low << 2) | (low >> 6);
		high = (high << 2) | (high >> 6);

		p.m_c[i] = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;
	}

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < num_pixels; i++)
		total_err += compute_color_distance_rgba(&p, &pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}